

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe_file_system.cpp
# Opt level: O1

unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> __thiscall
duckdb::PipeFileSystem::OpenPipe
          (PipeFileSystem *this,
          unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> *handle)

{
  PipeFile *this_00;
  _Head_base<0UL,_duckdb::FileHandle_*,_false> local_20;
  
  this_00 = (PipeFile *)operator_new(0x50);
  local_20._M_head_impl =
       (handle->super_unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>)._M_t
       .super___uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
       super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl;
  (handle->super_unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>)._M_t.
  super___uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
  super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl = (FileHandle *)0x0;
  PipeFile::PipeFile(this_00,(unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>
                              *)&local_20);
  if (local_20._M_head_impl != (FileHandle *)0x0) {
    (*(local_20._M_head_impl)->_vptr_FileHandle[1])();
  }
  (this->super_FileSystem)._vptr_FileSystem = (_func_int **)this_00;
  return (unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>)
         (unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>)this;
}

Assistant:

unique_ptr<FileHandle> PipeFileSystem::OpenPipe(unique_ptr<FileHandle> handle) {
	return make_uniq<PipeFile>(std::move(handle));
}